

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
BoundedAddBind(ClientContext *context,ScalarFunction *bound_function,
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *arguments)

{
  char cVar1;
  int32_t iVar2;
  int32_t iVar3;
  reference pvVar4;
  pointer pEVar5;
  reference pvVar6;
  BinderException *this;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_RCX;
  LogicalType local_70 [32];
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_50;
  LogicalType local_48 [24];
  
  BoundedType::GetDefault();
  pvVar4 = duckdb::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(in_RCX,0);
  pEVar5 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
           operator->(pvVar4);
  cVar1 = duckdb::LogicalType::operator==(local_70,(LogicalType *)(pEVar5 + 0x38));
  if (cVar1 == '\0') {
    duckdb::LogicalType::~LogicalType(local_70);
  }
  else {
    BoundedType::GetDefault();
    pvVar4 = duckdb::
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(in_RCX,1);
    pEVar5 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    cVar1 = duckdb::LogicalType::operator==(local_48,(LogicalType *)(pEVar5 + 0x38));
    local_50._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
         (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)context;
    duckdb::LogicalType::~LogicalType(local_48);
    duckdb::LogicalType::~LogicalType(local_70);
    if (cVar1 != '\0') {
      pvVar4 = duckdb::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(in_RCX,0);
      pEVar5 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               ::operator->(pvVar4);
      iVar2 = BoundedType::GetMaxValue((LogicalType *)(pEVar5 + 0x38));
      pvVar4 = duckdb::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(in_RCX,1);
      pEVar5 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               ::operator->(pvVar4);
      iVar3 = BoundedType::GetMaxValue((LogicalType *)(pEVar5 + 0x38));
      pvVar4 = duckdb::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(in_RCX,0);
      pEVar5 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               ::operator->(pvVar4);
      pvVar6 = duckdb::vector<duckdb::LogicalType,_true>::get<true>
                         ((vector<duckdb::LogicalType,_true> *)(arguments + 0x48),0);
      duckdb::LogicalType::operator=(pvVar6,(LogicalType *)(pEVar5 + 0x38));
      pvVar4 = duckdb::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(in_RCX,1);
      pEVar5 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               ::operator->(pvVar4);
      pvVar6 = duckdb::vector<duckdb::LogicalType,_true>::get<true>
                         ((vector<duckdb::LogicalType,_true> *)(arguments + 0x48),1);
      duckdb::LogicalType::operator=(pvVar6,(LogicalType *)(pEVar5 + 0x38));
      BoundedType::Get((BoundedType *)local_70,iVar2 + iVar3);
      duckdb::LogicalType::operator=((LogicalType *)(arguments + 0x90),local_70);
      duckdb::LogicalType::~LogicalType(local_70);
      *(undefined8 *)
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = 0;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
             local_50._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)local_70,"bounded_add expects two BOUNDED types",(allocator *)local_48);
  duckdb::BinderException::BinderException(this,(string *)local_70);
  __cxa_throw(this,&duckdb::BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> BoundedAddBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	if (BoundedType::GetDefault() == arguments[0]->return_type &&
	    BoundedType::GetDefault() == arguments[1]->return_type) {
		auto left_max_val = BoundedType::GetMaxValue(arguments[0]->return_type);
		auto right_max_val = BoundedType::GetMaxValue(arguments[1]->return_type);

		auto new_max_val = left_max_val + right_max_val;
		bound_function.arguments[0] = arguments[0]->return_type;
		bound_function.arguments[1] = arguments[1]->return_type;
		bound_function.return_type = BoundedType::Get(new_max_val);
	} else {
		throw BinderException("bounded_add expects two BOUNDED types");
	}
	return nullptr;
}